

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float32_unordered_quiet_arm(float32 a,float32 b,float_status *status)

{
  int iVar1;
  
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = 0;
  }
  if ((status->flush_inputs_to_zero != '\0') && ((b & 0x7fffff) != 0 && (b & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    b = 0;
  }
  if ((((~a & 0x7f800000) == 0 && (a & 0x7fffff) != 0) ||
      (iVar1 = 0, (b & 0x7fffff) != 0 && (~b & 0x7f800000) == 0)) &&
     (((a & 0x7fc00000) == 0x7f800000 && (a & 0x3fffff) != 0 ||
      (iVar1 = 1, (b & 0x3fffff) != 0 && (b & 0x7fc00000) == 0x7f800000)))) {
    status->float_exception_flags = status->float_exception_flags | 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}